

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O0

char * uloc_toLegacyType_63(char *keyword,char *value)

{
  UBool UVar1;
  char *pcVar2;
  char *legacyType;
  char *value_local;
  char *keyword_local;
  
  pcVar2 = ulocimp_toLegacyType_63(keyword,value,(UBool *)0x0,(UBool *)0x0);
  if ((pcVar2 != (char *)0x0) ||
     (UVar1 = isWellFormedLegacyType(value), keyword_local = value, UVar1 == '\0')) {
    keyword_local = pcVar2;
  }
  return keyword_local;
}

Assistant:

U_CAPI const char* U_EXPORT2
uloc_toLegacyType(const char* keyword, const char* value)
{
    const char* legacyType = ulocimp_toLegacyType(keyword, value, NULL, NULL);
    if (legacyType == NULL) {
        // Checks if the specified locale type is well-formed with the legacy locale syntax.
        //
        // Note:
        //  LDML/CLDR provides some definition of keyword syntax in
        //  * http://www.unicode.org/reports/tr35/#Unicode_locale_identifier and
        //  * http://www.unicode.org/reports/tr35/#Old_Locale_Extension_Syntax
        //  Values (types) can only consist of [0-9a-zA-Z], plus for legacy values
        //  we allow [/_-+] in the middle (e.g. "Etc/GMT+1", "Asia/Tel_Aviv")
        if (isWellFormedLegacyType(value)) {
            return value;
        }
    }
    return legacyType;
}